

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  Solver solver;
  Timer timer;
  undefined1 in_stack_fffffffffffffcef;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  int argc_00;
  Solver *this;
  string local_2f8 [8];
  Solver *in_stack_fffffffffffffd10;
  Solver *in_stack_fffffffffffffdc0;
  Solver *in_stack_fffffffffffffdd0;
  undefined1 local_20 [28];
  int local_4;
  
  local_4 = 0;
  argc_00 = (int)((ulong)local_20 >> 0x20);
  Timer::Timer((Timer *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  Timer::tic((Timer *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  this = (Solver *)&stack0xfffffffffffffd38;
  xLearn::Solver::Solver(in_stack_fffffffffffffd10);
  xLearn::Solver::SetTrain(this);
  xLearn::Solver::Initialize
            (this,argc_00,(char **)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  xLearn::Solver::StartWork(in_stack_fffffffffffffdd0);
  xLearn::Solver::Clear(in_stack_fffffffffffffdc0);
  fVar1 = Timer::toc((Timer *)this);
  StringPrintf_abi_cxx11_((char *)(double)fVar1,local_2f8,"Total time cost: %.2f (sec)");
  Color::print_info((string *)CONCAT44(fVar1,in_stack_fffffffffffffcf0),
                    (bool)in_stack_fffffffffffffcef);
  std::__cxx11::string::~string(local_2f8);
  local_4 = 0;
  xLearn::Solver::~Solver((Solver *)CONCAT44(fVar1,in_stack_fffffffffffffcf0));
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  Timer timer;
  timer.tic();

  xLearn::Solver solver;
  solver.SetTrain();
  solver.Initialize(argc, argv);
  solver.StartWork();
  solver.Clear();

  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), 
    NOT_IMPORTANT_MSG
  );

  return 0;
}